

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1520.c
# Opt level: O1

int test(char *URL)

{
  uint in_EAX;
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  upload_status upload_ctx;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 != 0) {
      uVar3 = curl_slist_append(0,"<recipient@example.com>");
      iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
      if ((((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar2,0x2e,1), iVar1 == 0)) &&
          (iVar1 = curl_easy_setopt(lVar2,0x4e2c,read_callback), iVar1 == 0)) &&
         (((iVar1 = curl_easy_setopt(lVar2,0x2719,(long)&uStack_28 + 4), iVar1 == 0 &&
           (iVar1 = curl_easy_setopt(lVar2,0x27ca,"<sender@example.com>"), iVar1 == 0)) &&
          ((iVar1 = curl_easy_setopt(lVar2,0x27cb,uVar3), iVar1 == 0 &&
           (iVar1 = curl_easy_setopt(lVar2,0x29,1), iVar1 == 0)))))) {
        iVar1 = curl_easy_perform(lVar2);
      }
      curl_slist_free_all(uVar3);
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;
  struct curl_slist *rcpt_list = NULL;
  struct upload_status upload_ctx = {0};

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  rcpt_list = curl_slist_append(rcpt_list, TO);
  /* more addresses can be added here
     rcpt_list = curl_slist_append(rcpt_list, "<others@example.com>");
  */

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_UPLOAD, 1L);
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);
  test_setopt(curl, CURLOPT_READDATA, &upload_ctx);
  test_setopt(curl, CURLOPT_MAIL_FROM, FROM);
  test_setopt(curl, CURLOPT_MAIL_RCPT, rcpt_list);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  res = curl_easy_perform(curl);

test_cleanup:

  curl_slist_free_all(rcpt_list);
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}